

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFileItem.cpp
# Opt level: O3

void __thiscall DatUnpacker::DatFileItem::~DatFileItem(DatFileItem *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->_packedData != (uchar *)0x0) {
    operator_delete__(this->_packedData);
  }
  this->_packedData = (uchar *)0x0;
  if (this->_unpackedData != (uchar *)0x0) {
    operator_delete__(this->_unpackedData);
  }
  this->_unpackedData = (uchar *)0x0;
  pcVar1 = (this->_name)._M_dataplus._M_p;
  paVar2 = &(this->_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

DatFileItem::~DatFileItem()
    {
        delete [] _packedData; _packedData = 0;
        delete [] _unpackedData; _unpackedData = 0;

    }